

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O2

void __thiscall
duckdb::Binder::Binder
          (Binder *this,ClientContext *context,shared_ptr<duckdb::Binder,_true> *parent_p,
          BinderType binder_type)

{
  shared_ptr<duckdb::Binder,_true> *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Binder *pBVar3;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->context = context;
  (this->CTE_bindings)._M_h._M_buckets = &(this->CTE_bindings)._M_h._M_single_bucket;
  (this->CTE_bindings)._M_h._M_bucket_count = 1;
  (this->CTE_bindings)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->CTE_bindings)._M_h._M_element_count = 0;
  (this->CTE_bindings)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->CTE_bindings)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->CTE_bindings)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->bound_ctes)._M_h._M_buckets = &(this->bound_ctes)._M_h._M_single_bucket;
  (this->bound_ctes)._M_h._M_bucket_count = 1;
  (this->bound_ctes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->bound_ctes)._M_h._M_element_count = 0;
  (this->bound_ctes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->bound_ctes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->bound_ctes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  BindContext::BindContext(&this->bind_context,this);
  (this->correlated_columns).
  super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
  super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->parameters).ptr = (BoundParameterMap *)0x0;
  (this->correlated_columns).
  super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
  super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->correlated_columns).
  super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
  super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->alias)._M_dataplus._M_p = (pointer)&(this->alias).field_2;
  (this->alias)._M_string_length = 0;
  (this->alias).field_2._M_local_buf[0] = '\0';
  (this->macro_binding).ptr = (DummyBinding *)0x0;
  (this->lambda_bindings).ptr = (vector<duckdb::DummyBinding,_true> *)0x0;
  (this->recursive_ctes)._M_h._M_buckets = &(this->recursive_ctes)._M_h._M_single_bucket;
  (this->recursive_ctes)._M_h._M_bucket_count = 1;
  (this->recursive_ctes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->recursive_ctes)._M_h._M_element_count = 0;
  (this->recursive_ctes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->recursive_ctes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->recursive_ctes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->parent).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (parent_p->internal).super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (parent_p->internal).super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (parent_p->internal).super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->parent).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  (this->parent).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = p_Var2;
  (parent_p->internal).super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->active_binders).
  super_vector<std::reference_wrapper<duckdb::ExpressionBinder>,_std::allocator<std::reference_wrapper<duckdb::ExpressionBinder>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::ExpressionBinder>,_std::allocator<std::reference_wrapper<duckdb::ExpressionBinder>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->bound_tables = 0;
  (this->active_binders).
  super_vector<std::reference_wrapper<duckdb::ExpressionBinder>,_std::allocator<std::reference_wrapper<duckdb::ExpressionBinder>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::ExpressionBinder>,_std::allocator<std::reference_wrapper<duckdb::ExpressionBinder>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->active_binders).
  super_vector<std::reference_wrapper<duckdb::ExpressionBinder>,_std::allocator<std::reference_wrapper<duckdb::ExpressionBinder>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::ExpressionBinder>,_std::allocator<std::reference_wrapper<duckdb::ExpressionBinder>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->has_unplanned_dependent_joins = false;
  this->is_outside_flattened = true;
  this->binder_type = binder_type;
  this->can_contain_nulls = false;
  (this->root_statement).ptr = (SQLStatement *)0x0;
  this->mode = STANDARD_BINDING;
  (this->table_names)._M_h._M_buckets = &(this->table_names)._M_h._M_single_bucket;
  (this->table_names)._M_h._M_bucket_count = 1;
  (this->table_names)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->table_names)._M_h._M_element_count = 0;
  (this->table_names)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->table_names)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->table_names)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->replacement_scans)._M_h._M_buckets = &(this->replacement_scans)._M_h._M_single_bucket;
  (this->replacement_scans)._M_h._M_bucket_count = 1;
  (this->replacement_scans)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->replacement_scans)._M_h._M_element_count = 0;
  (this->replacement_scans)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->replacement_scans)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->replacement_scans)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->bound_views)._M_h._M_buckets = &(this->bound_views)._M_h._M_single_bucket;
  (this->bound_views)._M_h._M_bucket_count = 1;
  (this->bound_views)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->bound_views)._M_h._M_element_count = 0;
  (this->bound_views)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->entry_retriever).callback.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->entry_retriever).callback._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->entry_retriever).callback.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->entry_retriever).callback.super__Function_base._M_functor + 8) = 0;
  (this->bound_views)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->bound_views)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->entry_retriever).context = context;
  (this->entry_retriever).at_clause.ptr = (BoundAtClause *)0x0;
  (this->entry_retriever).search_path.internal.
  super___shared_ptr<duckdb::CatalogSearchPath,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->entry_retriever).search_path.internal.
  super___shared_ptr<duckdb::CatalogSearchPath,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->unnamed_subquery_index = 1;
  StatementProperties::StatementProperties(&this->prop);
  if ((this->parent).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    this_00 = &this->parent;
    pBVar3 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
    CatalogEntryRetriever::Inherit(&this->entry_retriever,&pBVar3->entry_retriever);
    pBVar3 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
    (this->macro_binding).ptr = (pBVar3->macro_binding).ptr;
    pBVar3 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
    (this->lambda_bindings).ptr = (pBVar3->lambda_bindings).ptr;
    if (binder_type == REGULAR_BINDER) {
      pBVar3 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable(&local_68,&(pBVar3->bind_context).cte_bindings._M_h);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::operator=(&(this->bind_context).cte_bindings._M_h,&local_68);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_68);
      pBVar3 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::operator=((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&this->bind_context,
                  (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&pBVar3->bind_context);
      pBVar3 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
      (this->parameters).ptr = (pBVar3->parameters).ptr;
    }
  }
  return;
}

Assistant:

Binder::Binder(ClientContext &context, shared_ptr<Binder> parent_p, BinderType binder_type)
    : context(context), bind_context(*this), parent(std::move(parent_p)), bound_tables(0), binder_type(binder_type),
      entry_retriever(context) {
	if (parent) {
		entry_retriever.Inherit(parent->entry_retriever);

		// We have to inherit macro and lambda parameter bindings and from the parent binder, if there is a parent.
		macro_binding = parent->macro_binding;
		lambda_bindings = parent->lambda_bindings;

		if (binder_type == BinderType::REGULAR_BINDER) {
			// We have to inherit CTE bindings from the parent bind_context, if there is a parent.
			bind_context.SetCTEBindings(parent->bind_context.GetCTEBindings());
			bind_context.cte_references = parent->bind_context.cte_references;
			parameters = parent->parameters;
		}
	}
}